

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O3

string * __thiscall
(anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  uint __fd;
  int iVar7;
  long *buf;
  __dev_t _Var8;
  string *extraout_RAX;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  char *__s1;
  char *pcVar12;
  undefined1 local_e8 [8];
  stat statbuf;
  int local_38;
  byte local_31;
  int chars_scanned;
  
  __fd = open((char *)this,0);
  if ((int)__fd < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"file open error","");
  }
  else {
    iVar7 = fstat(__fd,(stat *)local_e8);
    if (iVar7 == 0) {
      buf = (long *)operator_new__(statbuf.st_rdev);
      _Var8 = anon_unknown.dwarf_3377::ReadPersistent(__fd,buf,statbuf.st_rdev);
      if (_Var8 == statbuf.st_rdev) {
        if (statbuf.st_rdev < 0x40) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,
                     "not enough data in profile for header + trailer","");
        }
        else if (*buf == 0) {
          if (buf[1] == 3) {
            if (buf[2] == 0) {
              if (buf[4] == 0) {
                uVar5 = 0x28;
                do {
                  uVar11 = uVar5;
                  if (statbuf.st_rdev - 0x18 < uVar11) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,"truncated sample header","");
                    goto LAB_0010b943;
                  }
                  lVar3 = *(long *)((long)buf + uVar11 + 8);
                  lVar2 = lVar3 * 8 + 0x10;
                  if ((long)(statbuf.st_rdev - lVar2) < (long)uVar11) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,"truncated sample","");
                    goto LAB_0010b943;
                  }
                  lVar4 = *(long *)((long)buf + uVar11);
                  if (lVar3 == 1 && lVar4 == 0) {
                    if (*(long *)((long)buf + uVar11 + 0x10) != 0) {
LAB_0010ba83:
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)__return_storage_ptr__,
                                 "error in sample: sample count < 1","");
                      goto LAB_0010b943;
                    }
                    break;
                  }
                  if (lVar4 == 0) goto LAB_0010ba83;
                  if (lVar3 == 0) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,"error in sample: num_pcs < 1","");
                    goto LAB_0010b943;
                  }
                  if (2 < lVar3 + 2U) {
                    lVar10 = 0;
                    do {
                      if (*(long *)((long)buf + lVar10 * 8 + uVar11 + 0x10) == 0) {
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,"error in sample: NULL PC","");
                        goto LAB_0010b943;
                      }
                      lVar10 = lVar10 + 1;
                    } while (lVar3 != lVar10);
                  }
                  uVar5 = uVar11 + lVar2;
                } while (lVar3 != 1 || lVar4 != 0);
                pcVar12 = (char *)(uVar11 + lVar2);
                if ((long)pcVar12 < (long)statbuf.st_rdev) {
                  if (*(char *)((long)buf + (long)((int)statbuf.st_rdev + -1)) == '\n') {
                    do {
                      pcVar9 = strchr((char *)((long)buf + (long)pcVar12),10);
                      *pcVar9 = '\0';
                      __s1 = pcVar12 + (long)buf + -1;
                      bVar6 = 1;
                      do {
                        local_31 = bVar6;
                        pcVar1 = __s1 + 1;
                        __s1 = __s1 + 1;
                        bVar6 = 0;
                      } while (*pcVar1 == ' ');
                      statbuf.__glibc_reserved[2] = (__syscall_slong_t)pcVar12;
                      iVar7 = strncmp(__s1,"build=",6);
                      if (iVar7 != 0) {
                        local_38 = -1;
                        __isoc99_sscanf(__s1,"%*x-%*x %*c%*c%*c%*c %*x %*x:%*x %*d %n",&local_38);
                        if ((local_31 & 0 < local_38) == 0) {
                          local_38 = -1;
                          __isoc99_sscanf(__s1,"%*x-%*x: %n",&local_38);
                          if (local_38 < 1) {
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)__return_storage_ptr__,
                                       "unrecognized line in text section","");
                            goto LAB_0010b943;
                          }
                        }
                      }
                      pcVar12 = pcVar9 + (statbuf.__glibc_reserved[2] - ((long)buf + (long)pcVar12))
                                         + 1;
                    } while ((long)pcVar12 < (long)statbuf.st_rdev);
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,"");
                  }
                  else {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,
                               "profile did not end with a complete line","");
                  }
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,"no list of mapped objects","");
                }
              }
              else {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)__return_storage_ptr__,
                           "error in header: non-zero padding value","");
              }
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"error in header: non-zero format version"
                         ,"");
            }
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"error in header: num_slots != 3","");
          }
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"error in header: non-zero count","");
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"read of whole file failed","");
      }
LAB_0010b943:
      operator_delete__(buf);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"fstat error","");
    }
  }
  anon_unknown.dwarf_3377::FileDescriptor::~FileDescriptor((FileDescriptor *)(ulong)__fd);
  return extraout_RAX;
}

Assistant:

std::string ProfileDataChecker::ValidateProfile() {
  FileDescriptor fd(open(filename_.c_str(), O_RDONLY));
  if (fd.get() < 0)
    return "file open error";

  struct stat statbuf;
  if (fstat(fd.get(), &statbuf) != 0)
    return "fstat error";
  if (statbuf.st_size != static_cast<ssize_t>(statbuf.st_size))
    return "file impossibly large";
  ssize_t filesize = statbuf.st_size;

  scoped_array<char> filedata(new char[filesize]);
  if (ReadPersistent(fd.get(), filedata.get(), filesize) != filesize)
    return "read of whole file failed";

  // Must have enough data for the header and the trailer.
  if (filesize < (5 + 3) * sizeof(ProfileDataSlot))
    return "not enough data in profile for header + trailer";

  // Check the header
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[0] != 0)
    return "error in header: non-zero count";
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[1] != 3)
    return "error in header: num_slots != 3";
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[2] != 0)
    return "error in header: non-zero format version";
  // Period (slot 3) can have any value.
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[4] != 0)
    return "error in header: non-zero padding value";
  ssize_t cur_offset = 5 * sizeof(ProfileDataSlot);

  // While there are samples, skip them.  Each sample consists of
  // at least three slots.
  bool seen_trailer = false;
  while (!seen_trailer) {
    if (cur_offset > filesize - 3 * sizeof(ProfileDataSlot))
      return "truncated sample header";
    ProfileDataSlot* sample =
        reinterpret_cast<ProfileDataSlot*>(filedata.get() + cur_offset);
    ProfileDataSlot slots_this_sample = 2 + sample[1];
    ssize_t size_this_sample = slots_this_sample * sizeof(ProfileDataSlot);
    if (cur_offset > filesize - size_this_sample)
      return "truncated sample";

    if (sample[0] == 0 && sample[1] == 1 && sample[2] == 0) {
      seen_trailer = true;
    } else {
      if (sample[0] < 1)
        return "error in sample: sample count < 1";
      if (sample[1] < 1)
        return "error in sample: num_pcs < 1";
      for (int i = 2; i < slots_this_sample; i++) {
        if (sample[i] == 0)
          return "error in sample: NULL PC";
      }
    }
    cur_offset += size_this_sample;
  }

  // There must be at least one line in the (text) list of mapped objects,
  // and it must be terminated by a newline.  Note, the use of newline
  // here and below Might not be reasonable on non-UNIX systems.
  if (cur_offset >= filesize)
    return "no list of mapped objects";
  if (filedata[filesize - 1] != '\n')
    return "profile did not end with a complete line";

  while (cur_offset < filesize) {
    char* line_start = filedata.get() + cur_offset;

    // Find the end of the line, and replace it with a NUL for easier
    // scanning.
    char* line_end = strchr(line_start, '\n');
    *line_end = '\0';

    // Advance past any leading space.  It's allowed in some lines,
    // but not in others.
    bool has_leading_space = false;
    char* line_cur = line_start;
    while (*line_cur == ' ') {
      has_leading_space = true;
      line_cur++;
    }

    bool found_match = false;

    // Check for build lines.
    if (!found_match) {
      found_match = (strncmp(line_cur, "build=", 6) == 0);
      // Anything may follow "build=", and leading space is allowed.
    }

    // A line from ProcMapsIterator::FormatLine, of the form:
    //
    // 40000000-40015000 r-xp 00000000 03:01 12845071   /lib/ld-2.3.2.so
    //
    // Leading space is not allowed.  The filename may be omitted or
    // may consist of multiple words, so we scan only up to the
    // space before the filename.
    if (!found_match) {
      int chars_scanned = -1;
      sscanf(line_cur, "%*x-%*x %*c%*c%*c%*c %*x %*x:%*x %*d %n",
             &chars_scanned);
      found_match = (chars_scanned > 0 && !has_leading_space);
    }

    // A line from DumpAddressMap, of the form:
    //
    // 40000000-40015000: /lib/ld-2.3.2.so
    //
    // Leading space is allowed.  The filename may be omitted or may
    // consist of multiple words, so we scan only up to the space
    // before the filename.
    if (!found_match) {
      int chars_scanned = -1;
      sscanf(line_cur, "%*x-%*x: %n", &chars_scanned);
      found_match = (chars_scanned > 0);
    }

    if (!found_match)
      return "unrecognized line in text section";

    cur_offset += (line_end - line_start) + 1;
  }

  return kNoError;
}